

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *extension)

{
  ulong __val;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  string *psVar6;
  char cVar7;
  string __str;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x50),
             *(long *)((long)this + 0x58) + *(long *)((long)this + 0x50));
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  __val = *(ulong *)((long)this + 0x80);
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar4 = '\x04';
    do {
      cVar7 = cVar4;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001510db;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001510db;
      }
      if (uVar5 < 10000) goto LAB_001510db;
      bVar3 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar4 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_001510db:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_48,local_40,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar1 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar1 != (string *)0x0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    psVar6 = (string *)0x0;
    do {
      if (pcVar2[(long)&(psVar6->_M_dataplus)._M_p] == '\\') {
        pcVar2[(long)&(psVar6->_M_dataplus)._M_p] = '/';
      }
      psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
    } while (psVar1 != psVar6);
  }
  return psVar1;
}

Assistant:

std::string BinaryWriterSpec::GetModuleFilename(const char* extension) {
  std::string result = module_filename_noext_;
  result += '.';
  result += std::to_string(num_modules_);
  result += extension;
  ConvertBackslashToSlash(&result);
  return result;
}